

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::to_trivial_mix_op
          (CompilerGLSL *this,SPIRType *type,string *op,uint32_t left,uint32_t right,uint32_t lerp)

{
  double dVar1;
  SPIRConstant *pSVar2;
  SPIRConstant *pSVar3;
  SPIRType *pSVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  string local_50;
  
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,left);
  pSVar3 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,right);
  pSVar4 = Compiler::expression_type(&this->super_Compiler,lerp);
  if (pSVar3 == (SPIRConstant *)0x0 || pSVar2 == (SPIRConstant *)0x0) {
    return false;
  }
  if (pSVar2->specialization != false) {
    return false;
  }
  if (pSVar3->specialization != false) {
    return false;
  }
  if (*(int *)&(pSVar4->super_IVariant).field_0xc != 2) {
    return false;
  }
  if (1 < pSVar4->vecsize) {
    return false;
  }
  switch(*(undefined4 *)&(type->super_IVariant).field_0xc) {
  case 5:
  case 6:
    if (*(short *)(pSVar2->m).c[0].r != 0) {
      return false;
    }
    if (*(short *)(pSVar3->m).c[0].r != 1) {
      return false;
    }
    break;
  case 7:
  case 8:
    if ((pSVar2->m).c[0].r[0].u32 != 0) {
      return false;
    }
    if ((pSVar3->m).c[0].r[0].u32 != 1) {
      return false;
    }
    break;
  case 9:
  case 10:
    if ((pSVar2->m).c[0].r[0].u64 != 0) {
      return false;
    }
    if ((pSVar3->m).c[0].r[0].u64 != 1) {
      return false;
    }
    break;
  default:
    goto switchD_00214034_caseD_b;
  case 0xc:
    fVar7 = SPIRConstant::f16_to_f32(*(uint16_t *)(pSVar2->m).c[0].r);
    if (fVar7 != 0.0) {
      return false;
    }
    if (NAN(fVar7)) {
      return false;
    }
    fVar7 = SPIRConstant::f16_to_f32(*(uint16_t *)(pSVar3->m).c[0].r);
    goto LAB_002140bc;
  case 0xd:
    fVar7 = (pSVar2->m).c[0].r[0].f32;
    if (fVar7 != 0.0) {
      return false;
    }
    if (NAN(fVar7)) {
      return false;
    }
    fVar7 = (pSVar3->m).c[0].r[0].f32;
LAB_002140bc:
    bVar5 = NAN(fVar7);
    bVar6 = fVar7 == 1.0;
LAB_002140ee:
    if ((!bVar6) || (bVar5)) {
switchD_00214034_caseD_b:
      return false;
    }
    break;
  case 0xe:
    dVar1 = (pSVar2->m).c[0].r[0].f64;
    if (dVar1 != 0.0) {
      return false;
    }
    if (NAN(dVar1)) {
      return false;
    }
    dVar1 = (pSVar3->m).c[0].r[0].f64;
    bVar5 = NAN(dVar1);
    bVar6 = dVar1 == 1.0;
    goto LAB_002140ee;
  }
  type_to_glsl_constructor_abi_cxx11_(&local_50,this,type);
  ::std::__cxx11::string::operator=((string *)op,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool CompilerGLSL::to_trivial_mix_op(const SPIRType &type, string &op, uint32_t left, uint32_t right, uint32_t lerp)
{
	auto *cleft = maybe_get<SPIRConstant>(left);
	auto *cright = maybe_get<SPIRConstant>(right);
	auto &lerptype = expression_type(lerp);

	// If our targets aren't constants, we cannot use construction.
	if (!cleft || !cright)
		return false;

	// If our targets are spec constants, we cannot use construction.
	if (cleft->specialization || cright->specialization)
		return false;

	// We can only use trivial construction if we have a scalar
	// (should be possible to do it for vectors as well, but that is overkill for now).
	if (lerptype.basetype != SPIRType::Boolean || lerptype.vecsize > 1)
		return false;

	// If our bool selects between 0 and 1, we can cast from bool instead, making our trivial constructor.
	bool ret = false;
	switch (type.basetype)
	{
	case SPIRType::Short:
	case SPIRType::UShort:
		ret = cleft->scalar_u16() == 0 && cright->scalar_u16() == 1;
		break;

	case SPIRType::Int:
	case SPIRType::UInt:
		ret = cleft->scalar() == 0 && cright->scalar() == 1;
		break;

	case SPIRType::Half:
		ret = cleft->scalar_f16() == 0.0f && cright->scalar_f16() == 1.0f;
		break;

	case SPIRType::Float:
		ret = cleft->scalar_f32() == 0.0f && cright->scalar_f32() == 1.0f;
		break;

	case SPIRType::Double:
		ret = cleft->scalar_f64() == 0.0 && cright->scalar_f64() == 1.0;
		break;

	case SPIRType::Int64:
	case SPIRType::UInt64:
		ret = cleft->scalar_u64() == 0 && cright->scalar_u64() == 1;
		break;

	default:
		break;
	}

	if (ret)
		op = type_to_glsl_constructor(type);
	return ret;
}